

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,Method_arg *ptr)

{
  Type *second;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  allocator<char> local_21;
  
  std::operator+(&local_48,"arg: ",ptr->name);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  second = ptr->type;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"type",&local_21);
  arrow(this,ptr,second,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->type->super_Base)._vptr_Base)(ptr->type,this);
  return;
}

Assistant:

void gv_visitor::visit(Method_arg* ptr) {
    box(ptr, "arg: " + *ptr->name);
    arrow(ptr, ptr->type, "type");
    ptr->type->accept(this);
}